

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lupica.c
# Opt level: O2

void write_u8(Emulator *e,Address addr,u8 value)

{
  MemoryTypeAddressPair MVar1;
  
  MVar1 = map_address(e,addr);
  if (MVar1.type == MEMORY_MAP_RAM) {
    (e->state).ram[(ulong)MVar1 >> 0x20] = value;
    return;
  }
  printf("\x1b[33minvalid memory write @0x%08x <= 0x%02x\n\x1b[37m",addr,(ulong)value);
  return;
}

Assistant:

void write_u8(Emulator* e, Address addr, u8 value) {
  MemoryTypeAddressPair pair = map_address(e, addr);
  switch (pair.type) {
    case MEMORY_MAP_RAM:
      e->state.ram[pair.addr] = value;
      break;

    default:
      printf(YELLOW "invalid memory write @0x%08x <= 0x%02x\n" WHITE, addr,
             value);
      break;
  }
}